

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
jessilib::json_parser::serialize_impl<char32_t,char32_t>
          (json_parser *this,
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *out_string,
          object *in_object)

{
  object *poVar1;
  object *out_string_00;
  bool bVar2;
  int iVar3;
  type tVar4;
  vector<jessilib::object,_std::allocator<jessilib::object>_> *this_00;
  reference in_object_00;
  size_t sVar5;
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  *this_01;
  reference pvVar6;
  invalid_argument *this_02;
  uint *puVar7;
  array_type *paVar8;
  map_type *this_03;
  u8string_view in_string;
  u8string_view in_string_00;
  u8string_view in_string_01;
  u8string_view in_string_02;
  u8string_view in_string_03;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> bVar9;
  string local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  __sv_type local_178;
  reference local_168;
  pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
  *item;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
  *__range3_1;
  char8_t *local_140;
  object *obj;
  const_iterator __end3;
  const_iterator __begin3;
  vector<jessilib::object,_std::allocator<jessilib::object>_> *__range3;
  char8_t *local_110;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_108;
  basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_> local_e8;
  __sv_type local_c8;
  longdouble local_b8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_a8;
  long local_78;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_70;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_50;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_40;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_30;
  object *local_20;
  object *in_object_local;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *out_string_local;
  json_parser *this_local;
  
  this_03 = (map_type *)out_string;
  local_20 = in_object;
  in_object_local = (object *)out_string;
  out_string_local =
       (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)this;
  if ((serialize_impl<char32_t,char32_t>(std::__cxx11::u32string&,jessilib::object_const&)::
       s_null_array == '\0') &&
     (iVar3 = __cxa_guard_acquire(&serialize_impl<char32_t,char32_t>(std::__cxx11::u32string&,jessilib::object_const&)
                                   ::s_null_array), this_03 = (map_type *)out_string, iVar3 != 0)) {
    std::vector<jessilib::object,_std::allocator<jessilib::object>_>::vector
              (&serialize_impl<char32_t,_char32_t>::s_null_array);
    paVar8 = &serialize_impl<char32_t,_char32_t>::s_null_array;
    __cxa_atexit(std::vector<jessilib::object,_std::allocator<jessilib::object>_>::~vector,
                 &serialize_impl<char32_t,_char32_t>::s_null_array,&__dso_handle);
    __cxa_guard_release(&serialize_impl<char32_t,char32_t>(std::__cxx11::u32string&,jessilib::object_const&)
                         ::s_null_array);
    this_03 = (map_type *)paVar8;
  }
  if ((serialize_impl<char32_t,char32_t>(std::__cxx11::u32string&,jessilib::object_const&)::
       s_null_map_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&serialize_impl<char32_t,char32_t>(std::__cxx11::u32string&,jessilib::object_const&)
                                   ::s_null_map_abi_cxx11_), iVar3 != 0)) {
    std::
    map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
    ::map(&serialize_impl<char32_t,char32_t>(std::__cxx11::u32string&,jessilib::object_const&)::
           s_null_map_abi_cxx11_);
    this_03 = &serialize_impl<char32_t,char32_t>(std::__cxx11::u32string&,jessilib::object_const&)::
               s_null_map_abi_cxx11_;
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                 ::~map,&serialize_impl<char32_t,char32_t>(std::__cxx11::u32string&,jessilib::object_const&)
                         ::s_null_map_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&serialize_impl<char32_t,char32_t>(std::__cxx11::u32string&,jessilib::object_const&)
                         ::s_null_map_abi_cxx11_);
  }
  tVar4 = object::type(local_20);
  out_string_00 = in_object_local;
  poVar1 = local_20;
  puVar7 = &switchD_002604d2::switchdataD_002d02c0;
  switch(tVar4) {
  case null:
    local_30 = sv("null",4);
    in_string._M_str = (char8_t *)puVar7;
    in_string._M_len = (size_t)local_30._M_str;
    simple_append<char32_t,char32_t>
              ((jessilib *)out_string_00,
               (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               local_30._M_len,in_string);
    break;
  case boolean:
    bVar2 = object::get<bool,_nullptr>(local_20,false);
    poVar1 = in_object_local;
    if (bVar2) {
      local_40 = sv("true",4);
      in_string_00._M_str = (char8_t *)puVar7;
      in_string_00._M_len = (size_t)local_40._M_str;
      simple_append<char32_t,char32_t>
                ((jessilib *)poVar1,
                 (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 local_40._M_len,in_string_00);
    }
    else {
      local_50 = sv("false",5);
      in_string_01._M_str = (char8_t *)puVar7;
      in_string_01._M_len = (size_t)local_50._M_str;
      simple_append<char32_t,char32_t>
                ((jessilib *)poVar1,
                 (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 local_50._M_len,in_string_01);
    }
    break;
  case integer:
    local_78 = object::get<long,_nullptr>(local_20,0);
    fmt::v8::format<char32_t[3],_long,_char32_t,_0>
              (&local_70,(char32_t (*) [3])empty_format_arg<char32_t>,&local_78);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator+=((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_object_local,&local_70);
    std::__cxx11::u32string::~u32string((u32string *)&local_70);
    break;
  case decimal:
    object::get<long_double,_nullptr>((longdouble *)local_20,(object *)this_03,(longdouble)0);
    fmt::v8::format<char32_t[3],_long_double,_char32_t,_0>
              (&local_a8,(char32_t (*) [3])empty_format_arg<char32_t>,&local_b8);
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator+=((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_object_local,&local_a8);
    std::__cxx11::u32string::~u32string((u32string *)&local_a8);
    break;
  case text:
    std::__cxx11::u8string::u8string((u8string *)&local_108);
    object::
    get<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_nullptr>
              (&local_e8,poVar1,&local_108);
    local_c8 = std::__cxx11::u8string::operator_cast_to_basic_string_view((u8string *)&local_e8);
    make_json_string<char32_t,char32_t>
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               out_string_00,local_c8);
    std::__cxx11::u8string::~u8string((u8string *)&local_e8);
    std::__cxx11::u8string::~u8string((u8string *)&local_108);
    break;
  default:
    this_02 = (invalid_argument *)__cxa_allocate_exception(0x10);
    tVar4 = object::type(local_20);
    std::__cxx11::to_string(&local_1b8,tVar4);
    std::operator+(&local_198,"Invalid data type: ",&local_1b8);
    std::invalid_argument::invalid_argument(this_02,(string *)&local_198);
    __cxa_throw(this_02,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  case array:
    sVar5 = object::size(local_20);
    poVar1 = in_object_local;
    if (sVar5 == 0) {
      bVar9 = sv("[]",2);
      __range3 = (vector<jessilib::object,_std::allocator<jessilib::object>_> *)bVar9._M_len;
      local_110 = bVar9._M_str;
      in_string_02._M_str = (char8_t *)puVar7;
      in_string_02._M_len = (size_t)local_110;
      simple_append<char32_t,char32_t>
                ((jessilib *)poVar1,
                 (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 __range3,in_string_02);
    }
    simple_append<char32_t,char32_t>
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_object_local,'[');
    this_00 = object::get<std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_nullptr>
                        (local_20,&serialize_impl<char32_t,_char32_t>::s_null_array);
    __end3 = std::vector<jessilib::object,_std::allocator<jessilib::object>_>::begin(this_00);
    obj = (object *)std::vector<jessilib::object,_std::allocator<jessilib::object>_>::end(this_00);
    while (bVar2 = __gnu_cxx::
                   operator==<const_jessilib::object_*,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>_>
                             (&__end3,(__normal_iterator<const_jessilib::object_*,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>_>
                                       *)&obj), ((bVar2 ^ 0xffU) & 1) != 0) {
      in_object_00 = __gnu_cxx::
                     __normal_iterator<const_jessilib::object_*,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>_>
                     ::operator*(&__end3);
      serialize_impl<char32_t,char32_t>
                (this,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                       *)in_object_local,in_object_00);
      simple_append<char32_t,char32_t>
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_object_local,',');
      __gnu_cxx::
      __normal_iterator<const_jessilib::object_*,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>_>
      ::operator++(&__end3);
    }
    pvVar6 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::back
                       ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)in_object_local);
    *pvVar6 = L']';
    break;
  case map:
    sVar5 = object::size(local_20);
    poVar1 = in_object_local;
    if (sVar5 == 0) {
      bVar9 = sv("{}",2);
      __range3_1 = (map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
                    *)bVar9._M_len;
      local_140 = bVar9._M_str;
      in_string_03._M_str = (char8_t *)puVar7;
      in_string_03._M_len = (size_t)local_140;
      simple_append<char32_t,char32_t>
                ((jessilib *)poVar1,
                 (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 __range3_1,in_string_03);
    }
    simple_append<char32_t,char32_t>
              ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
               in_object_local,'{');
    this_01 = object::
              get<std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>,_nullptr>
                        (local_20,&serialize_impl<char32_t,char32_t>(std::__cxx11::u32string&,jessilib::object_const&)
                                   ::s_null_map_abi_cxx11_);
    __end3_1 = std::
               map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
               ::begin(this_01);
    item = (pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>
            *)std::
              map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>
              ::end(this_01);
    while (bVar2 = std::operator==(&__end3_1,(_Self *)&item), ((bVar2 ^ 0xffU) & 1) != 0) {
      local_168 = std::
                  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
                  ::operator*(&__end3_1);
      poVar1 = in_object_local;
      local_178 = std::__cxx11::u8string::operator_cast_to_basic_string_view((u8string *)local_168);
      make_json_string<char32_t,char32_t>
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 poVar1,local_178);
      simple_append<char32_t,char32_t>
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_object_local,':');
      serialize_impl<char32_t,char32_t>
                (this,(basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                       *)in_object_local,&local_168->second);
      simple_append<char32_t,char32_t>
                ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 in_object_local,',');
      std::
      _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>
      ::operator++(&__end3_1);
    }
    pvVar6 = std::__cxx11::
             basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::back
                       ((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                         *)in_object_local);
    *pvVar6 = L'}';
  }
  return;
}

Assistant:

void json_parser::serialize_impl(std::basic_string<ResultCharT>& out_string, const object& in_object) {
	using namespace std::literals;
	static const object::array_type s_null_array;
	static const object::map_type s_null_map;

	switch (in_object.type()) {
		case object::type::null:
			simple_append<CharT, ResultCharT>(out_string, u8"null"sv);
			return;

		case object::type::boolean:
			if (in_object.get<bool>()) {
				simple_append<CharT, ResultCharT>(out_string, u8"true"sv);
				return;
			}
			simple_append<CharT, ResultCharT>(out_string, u8"false"sv);
			return;

		case object::type::integer:
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string += fmt::format(empty_format_arg<ResultCharT>, in_object.get<intmax_t>());
			}
			else if constexpr (std::is_same_v<ResultCharT, char>){
				auto encoded = fmt::format(empty_format_arg<CharT>, in_object.get<intmax_t>());
				out_string.append(reinterpret_cast<ResultCharT*>(encoded.data()), encoded.size() * sizeof(CharT));
			}
			return;

		case object::type::decimal:
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string += fmt::format(empty_format_arg<ResultCharT>, in_object.get<long double>());
			}
			else if constexpr (std::is_same_v<ResultCharT, char>){
				auto encoded = fmt::format(empty_format_arg<CharT>, in_object.get<long double>());
				out_string.append(reinterpret_cast<ResultCharT*>(encoded.data()), encoded.size() * sizeof(CharT));
			}
			return;

		case object::type::text:
			make_json_string<CharT, ResultCharT>(out_string, in_object.get<std::u8string>());
			return;

		case object::type::array: {
			if (in_object.size() == 0) {
				simple_append<CharT, ResultCharT>(out_string, u8"[]"sv);
			}

			simple_append<CharT, ResultCharT>(out_string, '[');

			// Serialize all objects in array
			for (auto& obj : in_object.get<object::array_type>(s_null_array)) {
				json_parser::serialize_impl<CharT, ResultCharT>(out_string, obj);
				simple_append<CharT, ResultCharT>(out_string, ',');
			}

			// Replace last comma with ']'
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string.back() = ']';
			}
			else if constexpr (std::is_same_v<ResultCharT, char>) {
				out_string.erase(out_string.size() - sizeof(CharT));
				simple_append<CharT, ResultCharT>(out_string, ']');
			}
			// else // not supported
			return;
		}

		case object::type::map: {
			if (in_object.size() == 0) {
				simple_append<CharT, ResultCharT>(out_string, u8"{}"sv);
			}

			simple_append<CharT, ResultCharT>(out_string, '{');

			// Serialize all objects in map
			for (auto& item : in_object.get<object::map_type>(s_null_map)) {
				make_json_string<CharT, ResultCharT>(out_string, item.first);
				simple_append<CharT, ResultCharT>(out_string, ':');
				json_parser::serialize_impl<CharT, ResultCharT>(out_string, item.second);
				simple_append<CharT, ResultCharT>(out_string, ',');
			}

			// Replace last comma with '}'
			if constexpr (sizeof(CharT) == sizeof(ResultCharT)) {
				out_string.back() = '}';
			}
			else if constexpr (std::is_same_v<ResultCharT, char>) {
				out_string.erase(out_string.size() - sizeof(CharT));
				simple_append<CharT, ResultCharT>(out_string, '}');
			}
			// else // not supported
			return;
		}

		default:
			throw std::invalid_argument{ "Invalid data type: " + std::to_string(static_cast<size_t>(in_object.type())) };
	}
}